

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O2

NTrodeObj * __thiscall
TrodesConfig::getNTrodeByID(NTrodeObj *__return_storage_ptr__,TrodesConfig *this,string *id)

{
  pointer pNVar1;
  __type _Var2;
  pointer pNVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pNVar3 = (this->nTrodes).super__Vector_base<NTrodeObj,_std::allocator<NTrodeObj>_>._M_impl.
           super__Vector_impl_data._M_start;
  pNVar1 = (this->nTrodes).super__Vector_base<NTrodeObj,_std::allocator<NTrodeObj>_>._M_impl.
           super__Vector_impl_data._M_finish;
  while( true ) {
    if (pNVar3 == pNVar1) {
      NTrodeObj::NTrodeObj(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    std::__cxx11::string::string((string *)&local_50,(string *)&pNVar3->id);
    _Var2 = std::operator==(&local_50,id);
    std::__cxx11::string::~string((string *)&local_50);
    if (_Var2) break;
    pNVar3 = pNVar3 + 1;
  }
  NTrodeObj::NTrodeObj(__return_storage_ptr__,pNVar3);
  return __return_storage_ptr__;
}

Assistant:

NTrodeObj TrodesConfig::getNTrodeByID(const std::string &id) const{
    for(auto const &nt : nTrodes){
        if(nt.getId() == id){
            return nt;
        }
    }
    return NTrodeObj();
}